

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::STY_ZP(CPU *this)

{
  byte bVar1;
  
  this->cycles = 3;
  bVar1 = GetByte(this);
  WriteByte(this,(ushort)bVar1,this->Y);
  return;
}

Assistant:

void CPU::STY_ZP()
{
    cycles = 3;
    WriteByte(GetByte(), Y);
}